

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::SceneLoader::SceneLoader(SceneLoader *this,IFilePartLoader *callingFilePartLoader)

{
  Scene *pSVar1;
  UniqueId local_30;
  
  FilePartLoader::FilePartLoader(&this->super_FilePartLoader,callingFilePartLoader);
  (this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader._vptr_ExtraDataLoader =
       (_func_int **)&PTR__SceneLoader_0095e100;
  pSVar1 = (Scene *)operator_new(0x30);
  IFilePartLoader::createUniqueId(&local_30,(IFilePartLoader *)this,SCENE);
  (pSVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>).mUniqueId.mFileId =
       local_30.mFileId;
  (pSVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>).mUniqueId.mClassId =
       local_30.mClassId;
  *(undefined4 *)
   &(pSVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>).mUniqueId.field_0x4 =
       local_30._4_4_;
  (pSVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>).mUniqueId.mObjectId =
       local_30.mObjectId;
  (pSVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>).super_Object._vptr_Object =
       (_func_int **)&PTR__Scene_0095e218;
  pSVar1->mInstanceVisualScene = (InstanceVisualScene *)0x0;
  pSVar1->mInstanceKinematicsScene = (InstanceKinematicsScene *)0x0;
  COLLADAFW::UniqueId::~UniqueId(&local_30);
  this->mCurrentScene = pSVar1;
  COLLADABU::hash_set<COLLADAFW::UniqueId>::hash_set(&this->mBoundNodes);
  this->mCurrentInstanceKinematicsScene = (KinematicsInstanceKinematicsScene *)0x0;
  this->mCurrentBindJointAxis = (KinematicsBindJointAxis *)0x0;
  (this->mCurrentCharacterData)._M_dataplus._M_p = (pointer)&(this->mCurrentCharacterData).field_2;
  (this->mCurrentCharacterData)._M_string_length = 0;
  (this->mCurrentCharacterData).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

SceneLoader::SceneLoader ( IFilePartLoader* callingFilePartLoader )
        : FilePartLoader(callingFilePartLoader)
        , mCurrentScene ( new COLLADAFW::Scene (createUniqueId(COLLADAFW::Scene::ID())) )
		, mCurrentInstanceKinematicsScene(0)
		, mCurrentBindJointAxis(0)
		, mCurrentCharacterData()
	{
	}